

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

class_<kratos::Const,_std::shared_ptr<kratos::Const>,_kratos::Var> * __thiscall
pybind11::class_<kratos::Const,std::shared_ptr<kratos::Const>,kratos::Var>::
def<kratos::Generator*(*)(),pybind11::return_value_policy>
          (class_<kratos::Const,std::shared_ptr<kratos::Const>,kratos::Var> *this,char *name_,
          _func_Generator_ptr **f,return_value_policy *extra)

{
  _func_Generator_ptr *f_00;
  handle local_58;
  name local_50;
  is_method local_48;
  object local_40;
  cpp_function local_38;
  cpp_function cf;
  
  f_00 = *f;
  local_48.class_.m_ptr = *(handle *)this;
  local_40.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  local_50.value = name_;
  getattr((pybind11 *)&cf,local_48.class_,name_,(PyObject *)&_Py_NoneStruct);
  local_58.m_ptr = (PyObject *)cf.super_function.super_object.super_handle.m_ptr;
  cpp_function::
  cpp_function<kratos::Generator*,,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::return_value_policy>
            (&local_38,f_00,&local_50,&local_48,(sibling *)&local_58,extra);
  object::~object((object *)&cf);
  object::~object(&local_40);
  pybind11::detail::add_class_method((object *)this,name_,&local_38);
  object::~object((object *)&local_38);
  return (class_<kratos::Const,_std::shared_ptr<kratos::Const>,_kratos::Var> *)this;
}

Assistant:

class_ &def(const char *name_, Func&& f, const Extra&... extra) {
        cpp_function cf(method_adaptor<type>(std::forward<Func>(f)), name(name_), is_method(*this),
                        sibling(getattr(*this, name_, none())), extra...);
        add_class_method(*this, name_, cf);
        return *this;
    }